

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_NUMBER::OEqual(_Type_NUMBER *this,Variable *obj1,Variable *obj2)

{
  Number *this_00;
  bool bVar1;
  Object *pOVar2;
  Type *this_01;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar3;
  Variable VVar4;
  
  pOVar2 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  pOVar2 = Variable::operator->(in_RCX);
  this_01 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(this_01,(Type *)obj1);
  if (bVar1) {
    pOVar2 = Variable::operator->((Variable *)this);
    *(undefined1 *)pOVar2->data = 0;
    puVar3 = extraout_RDX;
  }
  else {
    pOVar2 = Variable::operator->(obj2);
    this_00 = (Number *)pOVar2->data;
    pOVar2 = Variable::operator->(in_RCX);
    bVar1 = Number::operator==(this_00,(Number *)pOVar2->data);
    pOVar2 = Variable::operator->((Variable *)this);
    *(bool *)pOVar2->data = bVar1;
    puVar3 = extraout_RDX_00;
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OEqual(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    if (obj2->GetType() != *this)
        res->GetData<bool>() = false;
    else
        res->GetData<bool>() = (obj1->GetData<Number>() == obj2->GetData<Number>());
    return res;
}